

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrHandMeshVertexMSFT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  string *value_00;
  XrHandMeshVertexMSFT *pXVar1;
  bool bVar2;
  XrVector3f *value_01;
  invalid_argument *piVar3;
  allocator local_139;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [8];
  string normal_prefix;
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [8];
  string position_prefix;
  XrHandMeshVertexMSFT local_60;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_40;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *contents_local;
  string *psStack_30;
  bool is_pointer_local;
  string *type_string_local;
  string *prefix_local;
  XrHandMeshVertexMSFT *value_local;
  XrGeneratedDispatchTable *gen_dispatch_table_local;
  
  local_40 = contents;
  contents_local._7_1_ = is_pointer;
  psStack_30 = type_string;
  type_string_local = prefix;
  prefix_local = (string *)value;
  value_local = (XrHandMeshVertexMSFT *)gen_dispatch_table;
  PointerToHexString<XrHandMeshVertexMSFT>(&local_60);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if ((contents_local._7_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)prefix,".");
  }
  else {
    std::__cxx11::string::operator+=((string *)prefix,"->");
  }
  std::__cxx11::string::string(local_90,(string *)prefix);
  std::__cxx11::string::operator+=(local_90,"position");
  pXVar1 = value_local;
  value_00 = prefix_local;
  std::__cxx11::string::string(local_b0,local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"XrVector3f",&local_d1);
  bVar2 = ApiDumpOutputXrStruct
                    ((XrGeneratedDispatchTable *)pXVar1,(XrVector3f *)value_00,(string *)local_b0,
                     (string *)local_d0,false,local_40);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string(local_b0);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string(local_f8,(string *)prefix);
    std::__cxx11::string::operator+=(local_f8,"normal");
    pXVar1 = value_local;
    value_01 = (XrVector3f *)(prefix_local + 0xc);
    std::__cxx11::string::string(local_118,local_f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"XrVector3f",&local_139);
    bVar2 = ApiDumpOutputXrStruct
                      ((XrGeneratedDispatchTable *)pXVar1,value_01,(string *)local_118,
                       (string *)local_138,false,local_40);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::__cxx11::string::~string(local_118);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      gen_dispatch_table_local._7_1_ = 1;
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string(local_90);
      return (bool)(gen_dispatch_table_local._7_1_ & 1);
    }
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Invalid Operation");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"Invalid Operation");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrHandMeshVertexMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string position_prefix = prefix;
        position_prefix += "position";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->position, position_prefix, "XrVector3f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string normal_prefix = prefix;
        normal_prefix += "normal";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->normal, normal_prefix, "XrVector3f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}